

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pIn;
  BYTE *iStart;
  BYTE *iEnd;
  int *iLimit;
  char *pcVar1;
  undefined8 *puVar2;
  uint uVar3;
  BYTE *base;
  BYTE *pBVar4;
  U32 *pUVar5;
  U16 *pUVar6;
  int iVar7;
  ushort uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  int *ilimit_w;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  seqDef *psVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  U32 UVar22;
  uint uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  U32 UVar27;
  long lVar28;
  U32 UVar29;
  uint uVar30;
  int *piVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  BYTE *litEnd;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  byte bVar92;
  byte bVar93;
  byte bVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int *local_188;
  ulong local_178;
  ulong local_150;
  uint local_13c;
  int *local_128;
  U32 maxDistance;
  BYTE *litLimit_w;
  uint auStack_c8 [34];
  BYTE *local_40;
  U32 *local_38;
  char cVar49;
  undefined1 uVar76;
  char cVar77;
  undefined1 uVar78;
  char cVar79;
  undefined1 uVar80;
  char cVar81;
  
  base = (ms->window).base;
  pBVar4 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  iStart = base + uVar3;
  pBVar26 = pBVar4 + uVar3;
  local_40 = pBVar4 + (ms->window).lowLimit;
  local_188 = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar10 = (ms->cParams).minMatch;
  UVar29 = 6;
  if (uVar10 < 6) {
    UVar29 = uVar10;
  }
  uVar10 = (ms->cParams).windowLog;
  iEnd = (BYTE *)((long)src + srcSize);
  iLimit = (int *)((long)src + (srcSize - 0x10));
  local_13c = *rep;
  UVar27 = rep[1];
  local_38 = rep;
  ZSTD_row_fillHashCache
            (ms,base,5 - ((ms->cParams).searchLog < 5),UVar29,ms->nextToUpdate,(BYTE *)iLimit);
  uVar10 = 1 << ((byte)uVar10 & 0x1f);
  iVar11 = uVar3 - 1;
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
LAB_001dc9fc:
  do {
    if (iLimit <= local_188) {
      *local_38 = local_13c;
      local_38[1] = UVar27;
      return (long)iEnd - (long)src;
    }
    iVar36 = (int)local_188 - (int)base;
    iVar32 = iVar36 + 1;
    uVar21 = (ms->window).lowLimit;
    UVar29 = ms->loadedDictEnd;
    uVar23 = iVar32 - uVar10;
    if (iVar32 - uVar21 <= uVar10) {
      uVar23 = uVar21;
    }
    if (UVar29 != 0) {
      uVar23 = uVar21;
    }
    uVar33 = iVar32 - local_13c;
    pBVar17 = base;
    if (uVar33 < uVar3) {
      pBVar17 = pBVar4;
    }
    if (iVar11 - uVar33 < 3) {
LAB_001dcad1:
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      if (local_13c < (iVar36 - uVar23) + 1) {
        if (*(int *)((long)local_188 + 1) != *(int *)(pBVar17 + uVar33)) goto LAB_001dcad1;
        pBVar25 = iEnd;
        if (uVar33 < uVar3) {
          pBVar25 = pBVar26;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)((long)local_188 + 5),(BYTE *)((long)(pBVar17 + uVar33) + 4),
                            iEnd,pBVar25,iStart);
        uVar12 = sVar13 + 4;
      }
    }
    uVar23 = (ms->cParams).searchLog;
    uVar33 = (ms->cParams).minMatch;
    if (uVar23 < 5) {
      bVar19 = (byte)uVar23;
      if (uVar33 - 6 < 2) {
        pBVar17 = (ms->window).base;
        pBVar25 = (ms->window).dictBase;
        uVar14 = (long)local_188 - (long)pBVar17;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar33;
        if (uVar30 - uVar21 <= uVar33) {
          uVar23 = uVar21;
        }
        uVar33 = (ms->window).dictLimit;
        pUVar5 = ms->hashTable;
        pUVar6 = ms->tagTable;
        if (UVar29 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x38 - (char)ms->rowHashLog;
        for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1)
        {
          uVar34 = (uint)uVar35 & 7;
          uVar21 = ms->hashCache[uVar34];
          ms->hashCache[uVar34] =
               (U32)((ulong)(*(long *)(pBVar17 + uVar35 + 8) * -0x30e4432340650000) >>
                    (bVar20 & 0x3f));
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar34 = (byte)((char)pUVar6[uVar15] - 1) & 0xf;
          *(char *)(pUVar6 + uVar15) = (char)uVar34;
          *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar5[uVar15 + uVar34] = (uint)uVar35;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (bVar20 & 0x3f));
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar6[uVar14];
        pcVar1 = (char *)((long)pUVar6 + uVar14 * 2 + 1);
        uVar80 = (undefined1)(uVar21 >> 0x18);
        uVar78 = (undefined1)(uVar21 >> 0x10);
        uVar76 = (undefined1)(uVar21 >> 8);
        auVar51._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                  0x20);
        auVar51[3] = uVar76;
        auVar51[2] = uVar76;
        auVar51[0] = (undefined1)uVar21;
        auVar51[1] = auVar51[0];
        auVar51._8_8_ = 0;
        auVar83 = pshuflw(auVar51,auVar51,0);
        cVar49 = auVar83[0];
        auVar52[0] = -(cVar49 == *pcVar1);
        cVar77 = auVar83[1];
        auVar52[1] = -(cVar77 == pcVar1[1]);
        cVar79 = auVar83[2];
        auVar52[2] = -(cVar79 == pcVar1[2]);
        cVar81 = auVar83[3];
        auVar52[3] = -(cVar81 == pcVar1[3]);
        auVar52[4] = -(cVar49 == pcVar1[4]);
        auVar52[5] = -(cVar77 == pcVar1[5]);
        auVar52[6] = -(cVar79 == pcVar1[6]);
        auVar52[7] = -(cVar81 == pcVar1[7]);
        auVar52[8] = -(cVar49 == pcVar1[8]);
        auVar52[9] = -(cVar77 == pcVar1[9]);
        auVar52[10] = -(cVar79 == pcVar1[10]);
        auVar52[0xb] = -(cVar81 == pcVar1[0xb]);
        auVar52[0xc] = -(cVar49 == pcVar1[0xc]);
        auVar52[0xd] = -(cVar77 == pcVar1[0xd]);
        auVar52[0xe] = -(cVar79 == pcVar1[0xe]);
        auVar52[0xf] = -(cVar81 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
            lVar38 = lVar38 + 1) {
          iVar32 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
            }
          }
          if (pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_c8[lVar38] = pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar6 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar6 + uVar14) + (ulong)uVar21 + 1) = auVar51[0];
        UVar29 = ms->nextToUpdate;
        ms->nextToUpdate = UVar29 + 1;
        pUVar5[uVar14 + uVar21] = UVar29;
        uVar35 = 999999999;
        uVar14 = 3;
        for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
          uVar21 = auStack_c8[lVar28];
          if (uVar21 < uVar33) {
            if (*(int *)(pBVar25 + uVar21) == *local_188) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                  pBVar25 + uVar33,pBVar17 + uVar33);
              uVar15 = sVar13 + 4;
LAB_001dd23f:
              if ((uVar14 < uVar15) &&
                 (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar15,
                 (BYTE *)((long)local_188 + uVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
            uVar15 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
            goto LAB_001dd23f;
          }
        }
      }
      else if (uVar33 == 5) {
        pBVar17 = (ms->window).base;
        pBVar25 = (ms->window).dictBase;
        uVar14 = (long)local_188 - (long)pBVar17;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar33;
        if (uVar30 - uVar21 <= uVar33) {
          uVar23 = uVar21;
        }
        uVar33 = (ms->window).dictLimit;
        pUVar5 = ms->hashTable;
        pUVar6 = ms->tagTable;
        if (UVar29 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x38 - (char)ms->rowHashLog;
        for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1)
        {
          uVar34 = (uint)uVar35 & 7;
          uVar21 = ms->hashCache[uVar34];
          ms->hashCache[uVar34] =
               (U32)((ulong)(*(long *)(pBVar17 + uVar35 + 8) * -0x30e4432345000000) >>
                    (bVar20 & 0x3f));
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar34 = (byte)((char)pUVar6[uVar15] - 1) & 0xf;
          *(char *)(pUVar6 + uVar15) = (char)uVar34;
          *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar5[uVar15 + uVar34] = (uint)uVar35;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (bVar20 & 0x3f));
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar6[uVar14];
        pcVar1 = (char *)((long)pUVar6 + uVar14 * 2 + 1);
        uVar80 = (undefined1)(uVar21 >> 0x18);
        uVar78 = (undefined1)(uVar21 >> 0x10);
        uVar76 = (undefined1)(uVar21 >> 8);
        auVar56._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                  0x20);
        auVar56[3] = uVar76;
        auVar56[2] = uVar76;
        auVar56[0] = (undefined1)uVar21;
        auVar56[1] = auVar56[0];
        auVar56._8_8_ = 0;
        auVar83 = pshuflw(auVar56,auVar56,0);
        cVar49 = auVar83[0];
        auVar54[0] = -(cVar49 == *pcVar1);
        cVar77 = auVar83[1];
        auVar54[1] = -(cVar77 == pcVar1[1]);
        cVar79 = auVar83[2];
        auVar54[2] = -(cVar79 == pcVar1[2]);
        cVar81 = auVar83[3];
        auVar54[3] = -(cVar81 == pcVar1[3]);
        auVar54[4] = -(cVar49 == pcVar1[4]);
        auVar54[5] = -(cVar77 == pcVar1[5]);
        auVar54[6] = -(cVar79 == pcVar1[6]);
        auVar54[7] = -(cVar81 == pcVar1[7]);
        auVar54[8] = -(cVar49 == pcVar1[8]);
        auVar54[9] = -(cVar77 == pcVar1[9]);
        auVar54[10] = -(cVar79 == pcVar1[10]);
        auVar54[0xb] = -(cVar81 == pcVar1[0xb]);
        auVar54[0xc] = -(cVar49 == pcVar1[0xc]);
        auVar54[0xd] = -(cVar77 == pcVar1[0xd]);
        auVar54[0xe] = -(cVar79 == pcVar1[0xe]);
        auVar54[0xf] = -(cVar81 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar54 >> 7,0) & 1) | (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe | (ushort)(auVar54[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (uVar15 = (ulong)(uint)(0 << (bVar19 & 0x1f));
            (uVar21 != 0 && (1 << (bVar19 & 0x1f) != (int)uVar15)); uVar15 = uVar15 + 1) {
          iVar32 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
            }
          }
          if (pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_c8[uVar15] = pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar6 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar6 + uVar14) + (ulong)uVar21 + 1) = auVar56[0];
        UVar29 = ms->nextToUpdate;
        ms->nextToUpdate = UVar29 + 1;
        pUVar5[uVar14 + uVar21] = UVar29;
        uVar35 = 999999999;
        uVar14 = 3;
        for (uVar39 = 0; uVar15 != uVar39; uVar39 = uVar39 + 1) {
          uVar21 = auStack_c8[uVar39];
          if (uVar21 < uVar33) {
            if (*(int *)(pBVar25 + uVar21) == *local_188) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                  pBVar25 + uVar33,pBVar17 + uVar33);
              uVar16 = sVar13 + 4;
LAB_001dd9a3:
              if ((uVar14 < uVar16) &&
                 (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar16,
                 (BYTE *)((long)local_188 + uVar16) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
            uVar16 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
            goto LAB_001dd9a3;
          }
        }
      }
      else {
        pBVar17 = (ms->window).base;
        pBVar25 = (ms->window).dictBase;
        uVar14 = (long)local_188 - (long)pBVar17;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar33;
        if (uVar30 - uVar21 <= uVar33) {
          uVar23 = uVar21;
        }
        uVar33 = (ms->window).dictLimit;
        pUVar5 = ms->hashTable;
        pUVar6 = ms->tagTable;
        if (UVar29 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x18 - (char)ms->rowHashLog;
        for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1)
        {
          uVar34 = (uint)uVar35 & 7;
          uVar21 = ms->hashCache[uVar34];
          ms->hashCache[uVar34] =
               (uint)(*(int *)(pBVar17 + uVar35 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar34 = (byte)((char)pUVar6[uVar15] - 1) & 0xf;
          *(char *)(pUVar6 + uVar15) = (char)uVar34;
          *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar5[uVar15 + uVar34] = (uint)uVar35;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (uint)(*(int *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar6[uVar14];
        pcVar1 = (char *)((long)pUVar6 + uVar14 * 2 + 1);
        uVar80 = (undefined1)(uVar21 >> 0x18);
        uVar78 = (undefined1)(uVar21 >> 0x10);
        uVar76 = (undefined1)(uVar21 >> 8);
        auVar83._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                  0x20);
        auVar83[3] = uVar76;
        auVar83[2] = uVar76;
        auVar83[0] = (undefined1)uVar21;
        auVar83[1] = auVar83[0];
        auVar83._8_8_ = 0;
        auVar56 = pshuflw(auVar83,auVar83,0);
        cVar49 = auVar56[0];
        auVar57[0] = -(cVar49 == *pcVar1);
        cVar77 = auVar56[1];
        auVar57[1] = -(cVar77 == pcVar1[1]);
        cVar79 = auVar56[2];
        auVar57[2] = -(cVar79 == pcVar1[2]);
        cVar81 = auVar56[3];
        auVar57[3] = -(cVar81 == pcVar1[3]);
        auVar57[4] = -(cVar49 == pcVar1[4]);
        auVar57[5] = -(cVar77 == pcVar1[5]);
        auVar57[6] = -(cVar79 == pcVar1[6]);
        auVar57[7] = -(cVar81 == pcVar1[7]);
        auVar57[8] = -(cVar49 == pcVar1[8]);
        auVar57[9] = -(cVar77 == pcVar1[9]);
        auVar57[10] = -(cVar79 == pcVar1[10]);
        auVar57[0xb] = -(cVar81 == pcVar1[0xb]);
        auVar57[0xc] = -(cVar49 == pcVar1[0xc]);
        auVar57[0xd] = -(cVar77 == pcVar1[0xd]);
        auVar57[0xe] = -(cVar79 == pcVar1[0xe]);
        auVar57[0xf] = -(cVar81 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar57 >> 7,0) & 1) | (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe | (ushort)(auVar57[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
            lVar38 = lVar38 + 1) {
          iVar32 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
            }
          }
          if (pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_c8[lVar38] = pUVar5[uVar14 + (iVar32 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar6 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar6 + uVar14) + (ulong)uVar21 + 1) = auVar83[0];
        UVar29 = ms->nextToUpdate;
        ms->nextToUpdate = UVar29 + 1;
        pUVar5[uVar14 + uVar21] = UVar29;
        uVar35 = 999999999;
        uVar14 = 3;
        for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
          uVar21 = auStack_c8[lVar28];
          if (uVar21 < uVar33) {
            if (*(int *)(pBVar25 + uVar21) == *local_188) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                  pBVar25 + uVar33,pBVar17 + uVar33);
              uVar15 = sVar13 + 4;
LAB_001ddb49:
              if ((uVar14 < uVar15) &&
                 (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar15,
                 (BYTE *)((long)local_188 + uVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
            uVar15 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
            goto LAB_001ddb49;
          }
        }
      }
    }
    else if (uVar33 - 6 < 2) {
      pUVar5 = ms->hashTable;
      pUVar6 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar25 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)local_188 - (long)pBVar17;
      uVar33 = (uint)uVar14;
      bVar19 = 0x38 - (char)ms->rowHashLog;
      for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1) {
        uVar37 = (uint)uVar35 & 7;
        uVar34 = ms->hashCache[uVar37];
        ms->hashCache[uVar37] =
             (U32)((ulong)(*(long *)(pBVar17 + uVar35 + 8) * -0x30e4432340650000) >> (bVar19 & 0x3f)
                  );
        uVar15 = (ulong)(uVar34 >> 3 & 0xffffffe0);
        uVar37 = (byte)((char)pUVar6[uVar15] - 1) & 0x1f;
        *(char *)(pUVar6 + uVar15) = (char)uVar37;
        *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar15 * 2) = (char)uVar34;
        pUVar5[uVar15 + uVar37] = (uint)uVar35;
      }
      if (uVar30 < uVar33 - uVar21 && UVar29 == 0) {
        uVar21 = uVar33 - uVar30;
      }
      ms->nextToUpdate = uVar33;
      uVar30 = ms->hashCache[uVar33 & 7];
      ms->hashCache[uVar33 & 7] =
           (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                (bVar19 & 0x3f));
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar6 = pUVar6 + uVar14;
      bVar19 = (byte)*pUVar6;
      uVar80 = (undefined1)(uVar30 >> 0x18);
      uVar78 = (undefined1)(uVar30 >> 0x10);
      uVar76 = (undefined1)(uVar30 >> 8);
      auVar82._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >> 0x20)
      ;
      auVar82[3] = uVar76;
      auVar82[2] = uVar76;
      auVar82[0] = (byte)uVar30;
      auVar82[1] = auVar82[0];
      auVar82._8_8_ = 0;
      auVar83 = pshuflw(auVar82,auVar82,0);
      bVar20 = auVar83[0];
      auVar40[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
      bVar92 = auVar83[1];
      auVar40[1] = -((byte)pUVar6[1] == bVar92);
      bVar93 = auVar83[2];
      auVar40[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
      bVar94 = auVar83[3];
      auVar40[3] = -((byte)pUVar6[2] == bVar94);
      auVar40[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
      auVar40[5] = -((byte)pUVar6[3] == bVar92);
      auVar40[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
      auVar40[7] = -((byte)pUVar6[4] == bVar94);
      auVar40[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
      auVar40[9] = -((byte)pUVar6[5] == bVar92);
      auVar40[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
      auVar40[0xb] = -((byte)pUVar6[6] == bVar94);
      auVar40[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
      auVar40[0xd] = -((byte)pUVar6[7] == bVar92);
      auVar40[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
      auVar40[0xf] = -((byte)pUVar6[8] == bVar94);
      auVar50[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
      auVar50[1] = -((byte)pUVar6[9] == bVar92);
      auVar50[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
      auVar50[3] = -((byte)pUVar6[10] == bVar94);
      auVar50[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
      auVar50[5] = -((byte)pUVar6[0xb] == bVar92);
      auVar50[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
      auVar50[7] = -((byte)pUVar6[0xc] == bVar94);
      auVar50[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
      auVar50[9] = -((byte)pUVar6[0xd] == bVar92);
      auVar50[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
      auVar50[0xb] = -((byte)pUVar6[0xe] == bVar94);
      auVar50[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
      auVar50[0xd] = -((byte)pUVar6[0xf] == bVar92);
      auVar50[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
      auVar50[0xf] = -((byte)pUVar6[0x10] == bVar94);
      uVar34 = CONCAT22((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar50[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar40 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar40[0xf] >> 7) << 0xf);
      uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar34;
      }
      for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
        iVar32 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
          }
        }
        if (pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_c8[lVar38] = pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar6 = (byte)uVar21;
      *(byte *)((long)pUVar6 + (ulong)uVar21 + 1) = auVar82[0];
      UVar29 = ms->nextToUpdate;
      ms->nextToUpdate = UVar29 + 1;
      pUVar5[uVar14 + uVar21] = UVar29;
      uVar35 = 999999999;
      uVar14 = 3;
      for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
        uVar21 = auStack_c8[lVar28];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar25 + uVar21) == *local_188) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                pBVar25 + uVar23,pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001dd16e:
            if ((uVar14 < uVar15) &&
               (uVar35 = (ulong)((uVar33 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)local_188 + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
          goto LAB_001dd16e;
        }
      }
    }
    else if (uVar33 == 5) {
      pUVar5 = ms->hashTable;
      pUVar6 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar25 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)local_188 - (long)pBVar17;
      uVar33 = (uint)uVar14;
      bVar19 = 0x38 - (char)ms->rowHashLog;
      for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1) {
        uVar37 = (uint)uVar35 & 7;
        uVar34 = ms->hashCache[uVar37];
        ms->hashCache[uVar37] =
             (U32)((ulong)(*(long *)(pBVar17 + uVar35 + 8) * -0x30e4432345000000) >> (bVar19 & 0x3f)
                  );
        uVar15 = (ulong)(uVar34 >> 3 & 0xffffffe0);
        uVar37 = (byte)((char)pUVar6[uVar15] - 1) & 0x1f;
        *(char *)(pUVar6 + uVar15) = (char)uVar37;
        *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar15 * 2) = (char)uVar34;
        pUVar5[uVar15 + uVar37] = (uint)uVar35;
      }
      if (uVar30 < uVar33 - uVar21 && UVar29 == 0) {
        uVar21 = uVar33 - uVar30;
      }
      ms->nextToUpdate = uVar33;
      uVar30 = ms->hashCache[uVar33 & 7];
      ms->hashCache[uVar33 & 7] =
           (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                (bVar19 & 0x3f));
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar6 = pUVar6 + uVar14;
      bVar19 = (byte)*pUVar6;
      uVar80 = (undefined1)(uVar30 >> 0x18);
      uVar78 = (undefined1)(uVar30 >> 0x10);
      uVar76 = (undefined1)(uVar30 >> 8);
      auVar84._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >> 0x20)
      ;
      auVar84[3] = uVar76;
      auVar84[2] = uVar76;
      auVar84[0] = (byte)uVar30;
      auVar84[1] = auVar84[0];
      auVar84._8_8_ = 0;
      auVar83 = pshuflw(auVar84,auVar84,0);
      bVar20 = auVar83[0];
      auVar41[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
      bVar92 = auVar83[1];
      auVar41[1] = -((byte)pUVar6[1] == bVar92);
      bVar93 = auVar83[2];
      auVar41[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
      bVar94 = auVar83[3];
      auVar41[3] = -((byte)pUVar6[2] == bVar94);
      auVar41[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
      auVar41[5] = -((byte)pUVar6[3] == bVar92);
      auVar41[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
      auVar41[7] = -((byte)pUVar6[4] == bVar94);
      auVar41[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
      auVar41[9] = -((byte)pUVar6[5] == bVar92);
      auVar41[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
      auVar41[0xb] = -((byte)pUVar6[6] == bVar94);
      auVar41[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
      auVar41[0xd] = -((byte)pUVar6[7] == bVar92);
      auVar41[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
      auVar41[0xf] = -((byte)pUVar6[8] == bVar94);
      auVar53[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
      auVar53[1] = -((byte)pUVar6[9] == bVar92);
      auVar53[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
      auVar53[3] = -((byte)pUVar6[10] == bVar94);
      auVar53[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
      auVar53[5] = -((byte)pUVar6[0xb] == bVar92);
      auVar53[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
      auVar53[7] = -((byte)pUVar6[0xc] == bVar94);
      auVar53[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
      auVar53[9] = -((byte)pUVar6[0xd] == bVar92);
      auVar53[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
      auVar53[0xb] = -((byte)pUVar6[0xe] == bVar94);
      auVar53[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
      auVar53[0xd] = -((byte)pUVar6[0xf] == bVar92);
      auVar53[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
      auVar53[0xf] = -((byte)pUVar6[0x10] == bVar94);
      uVar34 = CONCAT22((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar53[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar41 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar41[0xf] >> 7) << 0xf);
      uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar34;
      }
      for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
        iVar32 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
          }
        }
        if (pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_c8[lVar38] = pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar6 = (byte)uVar21;
      *(byte *)((long)pUVar6 + (ulong)uVar21 + 1) = auVar84[0];
      UVar29 = ms->nextToUpdate;
      ms->nextToUpdate = UVar29 + 1;
      pUVar5[uVar14 + uVar21] = UVar29;
      uVar35 = 999999999;
      uVar14 = 3;
      for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
        uVar21 = auStack_c8[lVar28];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar25 + uVar21) == *local_188) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                pBVar25 + uVar23,pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001dd7d5:
            if ((uVar14 < uVar15) &&
               (uVar35 = (ulong)((uVar33 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)local_188 + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
          goto LAB_001dd7d5;
        }
      }
    }
    else {
      pUVar5 = ms->hashTable;
      pUVar6 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar25 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)local_188 - (long)pBVar17;
      uVar33 = (uint)uVar14;
      bVar19 = 0x18 - (char)ms->rowHashLog;
      for (uVar35 = (ulong)ms->nextToUpdate; uVar35 < (uVar14 & 0xffffffff); uVar35 = uVar35 + 1) {
        uVar37 = (uint)uVar35 & 7;
        uVar34 = ms->hashCache[uVar37];
        ms->hashCache[uVar37] =
             (uint)(*(int *)(pBVar17 + uVar35 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
        uVar15 = (ulong)(uVar34 >> 3 & 0xffffffe0);
        uVar37 = (byte)((char)pUVar6[uVar15] - 1) & 0x1f;
        *(char *)(pUVar6 + uVar15) = (char)uVar37;
        *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar15 * 2) = (char)uVar34;
        pUVar5[uVar15 + uVar37] = (uint)uVar35;
      }
      if (uVar30 < uVar33 - uVar21 && UVar29 == 0) {
        uVar21 = uVar33 - uVar30;
      }
      ms->nextToUpdate = uVar33;
      uVar30 = ms->hashCache[uVar33 & 7];
      ms->hashCache[uVar33 & 7] =
           (uint)(*(int *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar6 = pUVar6 + uVar14;
      bVar19 = (byte)*pUVar6;
      uVar80 = (undefined1)(uVar30 >> 0x18);
      uVar78 = (undefined1)(uVar30 >> 0x10);
      uVar76 = (undefined1)(uVar30 >> 8);
      auVar85._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >> 0x20)
      ;
      auVar85[3] = uVar76;
      auVar85[2] = uVar76;
      auVar85[0] = (byte)uVar30;
      auVar85[1] = auVar85[0];
      auVar85._8_8_ = 0;
      auVar83 = pshuflw(auVar85,auVar85,0);
      bVar20 = auVar83[0];
      auVar42[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
      bVar92 = auVar83[1];
      auVar42[1] = -((byte)pUVar6[1] == bVar92);
      bVar93 = auVar83[2];
      auVar42[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
      bVar94 = auVar83[3];
      auVar42[3] = -((byte)pUVar6[2] == bVar94);
      auVar42[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
      auVar42[5] = -((byte)pUVar6[3] == bVar92);
      auVar42[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
      auVar42[7] = -((byte)pUVar6[4] == bVar94);
      auVar42[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
      auVar42[9] = -((byte)pUVar6[5] == bVar92);
      auVar42[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
      auVar42[0xb] = -((byte)pUVar6[6] == bVar94);
      auVar42[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
      auVar42[0xd] = -((byte)pUVar6[7] == bVar92);
      auVar42[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
      auVar42[0xf] = -((byte)pUVar6[8] == bVar94);
      auVar55[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
      auVar55[1] = -((byte)pUVar6[9] == bVar92);
      auVar55[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
      auVar55[3] = -((byte)pUVar6[10] == bVar94);
      auVar55[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
      auVar55[5] = -((byte)pUVar6[0xb] == bVar92);
      auVar55[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
      auVar55[7] = -((byte)pUVar6[0xc] == bVar94);
      auVar55[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
      auVar55[9] = -((byte)pUVar6[0xd] == bVar92);
      auVar55[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
      auVar55[0xb] = -((byte)pUVar6[0xe] == bVar94);
      auVar55[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
      auVar55[0xd] = -((byte)pUVar6[0xf] == bVar92);
      auVar55[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
      auVar55[0xf] = -((byte)pUVar6[0x10] == bVar94);
      uVar34 = CONCAT22((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar55[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar42 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar42[0xf] >> 7) << 0xf);
      uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar34;
      }
      for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
        iVar32 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
          }
        }
        if (pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_c8[lVar38] = pUVar5[uVar14 + (iVar32 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar6 = (byte)uVar21;
      *(byte *)((long)pUVar6 + (ulong)uVar21 + 1) = auVar85[0];
      UVar29 = ms->nextToUpdate;
      ms->nextToUpdate = UVar29 + 1;
      pUVar5[uVar14 + uVar21] = UVar29;
      uVar35 = 999999999;
      uVar14 = 3;
      for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
        uVar21 = auStack_c8[lVar28];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar25 + uVar21) == *local_188) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(local_188 + 1),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                pBVar25 + uVar23,pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001dda70:
            if ((uVar14 < uVar15) &&
               (uVar35 = (ulong)((uVar33 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)local_188 + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)local_188 + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)local_188,pBVar17 + uVar21,iEnd);
          goto LAB_001dda70;
        }
      }
    }
    uVar15 = uVar12;
    if (uVar12 < uVar14) {
      uVar15 = uVar14;
    }
    if (3 < uVar15) {
      pIn = local_188;
      if (uVar14 <= uVar12) {
        uVar35 = 0;
        local_188 = (int *)((long)local_188 + 1);
      }
LAB_001ddbd8:
      do {
        iVar32 = iVar36;
        local_150 = uVar15;
        piVar31 = pIn;
        local_178 = uVar35;
        if (iLimit <= piVar31) {
          local_128 = local_188;
          break;
        }
        pIn = (int *)((long)piVar31 + 1);
        iVar36 = iVar32 + 1;
        if (uVar35 == 0) {
          local_128 = local_188;
          local_178 = 0;
        }
        else {
          UVar29 = (ms->window).lowLimit;
          UVar22 = iVar36 - uVar10;
          if (iVar36 - UVar29 <= uVar10) {
            UVar22 = UVar29;
          }
          if (ms->loadedDictEnd != 0) {
            UVar22 = UVar29;
          }
          uVar21 = iVar36 - local_13c;
          pBVar17 = base;
          if (uVar21 < uVar3) {
            pBVar17 = pBVar4;
          }
          if (((iVar11 - uVar21 < 3) || (iVar36 - UVar22 <= local_13c)) ||
             (*pIn != *(int *)(pBVar17 + uVar21))) {
            local_128 = local_188;
          }
          else {
            pBVar25 = iEnd;
            if (uVar21 < uVar3) {
              pBVar25 = pBVar26;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar31 + 5),(BYTE *)((long)(pBVar17 + uVar21) + 4),
                                iEnd,pBVar25,iStart);
            if (sVar13 < 0xfffffffffffffffc) {
              uVar23 = (int)uVar35 + 1;
              uVar21 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              local_128 = local_188;
              if ((int)((uVar21 ^ 0x1f) + (int)local_150 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
                local_178 = 0;
                local_150 = sVar13 + 4;
                local_128 = pIn;
              }
            }
            else {
              local_128 = local_188;
            }
          }
        }
        uVar21 = (ms->cParams).searchLog;
        uVar23 = (ms->cParams).minMatch;
        if (uVar21 < 5) {
          bVar19 = (byte)uVar21;
          if (uVar23 - 6 < 2) {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432340650000) >>
                        (bVar20 & 0x3f));
              uVar35 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar20 & 0x3f));
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar59._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar59[3] = uVar76;
            auVar59[2] = uVar76;
            auVar59[0] = (undefined1)uVar21;
            auVar59[1] = auVar59[0];
            auVar59._8_8_ = 0;
            auVar83 = pshuflw(auVar59,auVar59,0);
            cVar49 = auVar83[0];
            auVar60[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar60[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar60[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar60[3] = -(cVar81 == pcVar1[3]);
            auVar60[4] = -(cVar49 == pcVar1[4]);
            auVar60[5] = -(cVar77 == pcVar1[5]);
            auVar60[6] = -(cVar79 == pcVar1[6]);
            auVar60[7] = -(cVar81 == pcVar1[7]);
            auVar60[8] = -(cVar49 == pcVar1[8]);
            auVar60[9] = -(cVar77 == pcVar1[9]);
            auVar60[10] = -(cVar79 == pcVar1[10]);
            auVar60[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar60[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar60[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar60[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar60[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar60[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar7 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar59[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001de4be:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001de4be;
              }
            }
          }
          else if (uVar23 == 5) {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432345000000) >>
                        (bVar20 & 0x3f));
              uVar35 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar20 & 0x3f));
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar62._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar62[3] = uVar76;
            auVar62[2] = uVar76;
            auVar62[0] = (undefined1)uVar21;
            auVar62[1] = auVar62[0];
            auVar62._8_8_ = 0;
            auVar83 = pshuflw(auVar62,auVar62,0);
            cVar49 = auVar83[0];
            auVar63[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar63[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar63[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar63[3] = -(cVar81 == pcVar1[3]);
            auVar63[4] = -(cVar49 == pcVar1[4]);
            auVar63[5] = -(cVar77 == pcVar1[5]);
            auVar63[6] = -(cVar79 == pcVar1[6]);
            auVar63[7] = -(cVar81 == pcVar1[7]);
            auVar63[8] = -(cVar49 == pcVar1[8]);
            auVar63[9] = -(cVar77 == pcVar1[9]);
            auVar63[10] = -(cVar79 == pcVar1[10]);
            auVar63[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar63[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar63[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar63[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar63[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar63[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && (1 << (bVar19 & 0x1f) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar7 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar62[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001dec4e:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001dec4e;
              }
            }
          }
          else {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x18 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (uint)(*(int *)(pBVar17 + uVar14 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
              uVar35 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (uint)(*(int *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar20 & 0x1f);
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar65._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar65[3] = uVar76;
            auVar65[2] = uVar76;
            auVar65[0] = (undefined1)uVar21;
            auVar65[1] = auVar65[0];
            auVar65._8_8_ = 0;
            auVar83 = pshuflw(auVar65,auVar65,0);
            cVar49 = auVar83[0];
            auVar66[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar66[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar66[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar66[3] = -(cVar81 == pcVar1[3]);
            auVar66[4] = -(cVar49 == pcVar1[4]);
            auVar66[5] = -(cVar77 == pcVar1[5]);
            auVar66[6] = -(cVar79 == pcVar1[6]);
            auVar66[7] = -(cVar81 == pcVar1[7]);
            auVar66[8] = -(cVar49 == pcVar1[8]);
            auVar66[9] = -(cVar77 == pcVar1[9]);
            auVar66[10] = -(cVar79 == pcVar1[10]);
            auVar66[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar66[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar66[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar66[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar66[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar66 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar66[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar7 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar65[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001dee0f:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001dee0f;
              }
            }
          }
        }
        else if (uVar23 - 6 < 2) {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432340650000) >>
                      (bVar19 & 0x3f));
            uVar35 = (ulong)(uVar34 >> 3 & 0x1fffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar19 & 0x3f));
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar86._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar86[3] = uVar76;
          auVar86[2] = uVar76;
          auVar86[0] = (byte)uVar30;
          auVar86[1] = auVar86[0];
          auVar86._8_8_ = 0;
          auVar83 = pshuflw(auVar86,auVar86,0);
          bVar20 = auVar83[0];
          auVar43[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar43[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar43[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar43[3] = -((byte)pUVar6[2] == bVar94);
          auVar43[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar43[5] = -((byte)pUVar6[3] == bVar92);
          auVar43[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar43[7] = -((byte)pUVar6[4] == bVar94);
          auVar43[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar43[9] = -((byte)pUVar6[5] == bVar92);
          auVar43[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar43[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar43[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar43[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar43[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar43[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar58[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar58[1] = -((byte)pUVar6[9] == bVar92);
          auVar58[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar58[3] = -((byte)pUVar6[10] == bVar94);
          auVar58[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar58[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar58[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar58[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar58[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar58[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar58[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar58[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar58[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar58[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar58[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar58[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar58[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar43[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar7 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar86[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001de3da:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001de3da;
            }
          }
        }
        else if (uVar23 == 5) {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432345000000) >>
                      (bVar19 & 0x3f));
            uVar35 = (ulong)(uVar34 >> 3 & 0x1fffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar19 & 0x3f));
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar87._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar87[3] = uVar76;
          auVar87[2] = uVar76;
          auVar87[0] = (byte)uVar30;
          auVar87[1] = auVar87[0];
          auVar87._8_8_ = 0;
          auVar83 = pshuflw(auVar87,auVar87,0);
          bVar20 = auVar83[0];
          auVar44[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar44[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar44[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar44[3] = -((byte)pUVar6[2] == bVar94);
          auVar44[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar44[5] = -((byte)pUVar6[3] == bVar92);
          auVar44[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar44[7] = -((byte)pUVar6[4] == bVar94);
          auVar44[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar44[9] = -((byte)pUVar6[5] == bVar92);
          auVar44[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar44[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar44[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar44[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar44[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar44[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar61[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar61[1] = -((byte)pUVar6[9] == bVar92);
          auVar61[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar61[3] = -((byte)pUVar6[10] == bVar94);
          auVar61[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar61[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar61[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar61[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar61[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar61[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar61[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar61[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar61[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar61[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar61[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar61[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar61[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar44[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar7 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar87[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dea72:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001dea72;
            }
          }
        }
        else {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x18 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (uint)(*(int *)(pBVar17 + uVar14 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
            uVar35 = (ulong)(uVar34 >> 3 & 0x1fffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (uint)(*(int *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar19 & 0x1f);
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar88._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar88[3] = uVar76;
          auVar88[2] = uVar76;
          auVar88[0] = (byte)uVar30;
          auVar88[1] = auVar88[0];
          auVar88._8_8_ = 0;
          auVar83 = pshuflw(auVar88,auVar88,0);
          bVar20 = auVar83[0];
          auVar45[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar45[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar45[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar45[3] = -((byte)pUVar6[2] == bVar94);
          auVar45[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar45[5] = -((byte)pUVar6[3] == bVar92);
          auVar45[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar45[7] = -((byte)pUVar6[4] == bVar94);
          auVar45[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar45[9] = -((byte)pUVar6[5] == bVar92);
          auVar45[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar45[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar45[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar45[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar45[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar45[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar64[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar64[1] = -((byte)pUVar6[9] == bVar92);
          auVar64[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar64[3] = -((byte)pUVar6[10] == bVar94);
          auVar64[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar64[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar64[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar64[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar64[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar64[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar64[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar64[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar64[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar64[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar64[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar64[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar64[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar45 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar45[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar7 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar7 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar88[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 5),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001ded2b:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001ded2b;
            }
          }
        }
        if (3 < uVar15) {
          uVar23 = (int)local_178 + 1;
          uVar21 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          uVar23 = (int)uVar35 + 1;
          iVar7 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          local_188 = pIn;
          if ((int)((uVar21 ^ 0x1f) + (int)local_150 * 4 + -0x1b) < (int)uVar15 * 4 - iVar7)
          goto LAB_001ddbd8;
        }
        if (iLimit <= pIn) break;
        pIn = (int *)((long)piVar31 + 2);
        iVar36 = iVar32 + 2;
        if (local_178 == 0) {
          local_178 = 0;
        }
        else {
          UVar29 = (ms->window).lowLimit;
          UVar22 = iVar36 - uVar10;
          if (iVar36 - UVar29 <= uVar10) {
            UVar22 = UVar29;
          }
          if (ms->loadedDictEnd != 0) {
            UVar22 = UVar29;
          }
          uVar21 = iVar36 - local_13c;
          pBVar17 = base;
          if (uVar21 < uVar3) {
            pBVar17 = pBVar4;
          }
          if (((2 < iVar11 - uVar21) && (local_13c < iVar36 - UVar22)) &&
             (*pIn == *(int *)(pBVar17 + uVar21))) {
            pBVar25 = iEnd;
            if (uVar21 < uVar3) {
              pBVar25 = pBVar26;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar31 + 6),(BYTE *)((long)(pBVar17 + uVar21) + 4),
                                iEnd,pBVar25,iStart);
            if (sVar13 < 0xfffffffffffffffc) {
              uVar23 = (int)local_178 + 1;
              uVar21 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              if ((int)((uVar21 ^ 0x1f) + (int)local_150 * 4 + -0x1e) < (int)(sVar13 + 4) * 4) {
                local_178 = 0;
                local_150 = sVar13 + 4;
                local_128 = pIn;
              }
            }
          }
        }
        uVar21 = (ms->cParams).searchLog;
        uVar23 = (ms->cParams).minMatch;
        if (uVar21 < 5) {
          bVar19 = (byte)uVar21;
          if (uVar23 - 6 < 2) {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432340650000) >>
                        (bVar20 & 0x3f));
              uVar35 = (ulong)(uVar21 >> 4 & 0xfffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar20 & 0x3f));
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar68._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar68[3] = uVar76;
            auVar68[2] = uVar76;
            auVar68[0] = (undefined1)uVar21;
            auVar68[1] = auVar68[0];
            auVar68._8_8_ = 0;
            auVar83 = pshuflw(auVar68,auVar68,0);
            cVar49 = auVar83[0];
            auVar69[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar69[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar69[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar69[3] = -(cVar81 == pcVar1[3]);
            auVar69[4] = -(cVar49 == pcVar1[4]);
            auVar69[5] = -(cVar77 == pcVar1[5]);
            auVar69[6] = -(cVar79 == pcVar1[6]);
            auVar69[7] = -(cVar81 == pcVar1[7]);
            auVar69[8] = -(cVar49 == pcVar1[8]);
            auVar69[9] = -(cVar77 == pcVar1[9]);
            auVar69[10] = -(cVar79 == pcVar1[10]);
            auVar69[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar69[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar69[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar69[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar69[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar69 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar69[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar32 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar68[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001df72e:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001df72e;
              }
            }
          }
          else if (uVar23 == 5) {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432345000000) >>
                        (bVar20 & 0x3f));
              uVar35 = (ulong)(uVar21 >> 4 & 0xfffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar20 & 0x3f));
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar71._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar71[3] = uVar76;
            auVar71[2] = uVar76;
            auVar71[0] = (undefined1)uVar21;
            auVar71[1] = auVar71[0];
            auVar71._8_8_ = 0;
            auVar83 = pshuflw(auVar71,auVar71,0);
            cVar49 = auVar83[0];
            auVar72[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar72[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar72[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar72[3] = -(cVar81 == pcVar1[3]);
            auVar72[4] = -(cVar49 == pcVar1[4]);
            auVar72[5] = -(cVar77 == pcVar1[5]);
            auVar72[6] = -(cVar79 == pcVar1[6]);
            auVar72[7] = -(cVar81 == pcVar1[7]);
            auVar72[8] = -(cVar49 == pcVar1[8]);
            auVar72[9] = -(cVar77 == pcVar1[9]);
            auVar72[10] = -(cVar79 == pcVar1[10]);
            auVar72[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar72[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar72[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar72[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar72[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar72 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar72[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && (1 << (bVar19 & 0x1f) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar32 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar71[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001dfebc:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001dfebc;
              }
            }
          }
          else {
            pUVar5 = ms->hashTable;
            pUVar6 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar12 = (long)pIn - (long)pBVar17;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar12;
            uVar23 = uVar30 - uVar33;
            if (uVar30 - uVar21 <= uVar33) {
              uVar23 = uVar21;
            }
            pBVar25 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x18 - (char)ms->rowHashLog;
            for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff);
                uVar14 = uVar14 + 1) {
              uVar34 = (uint)uVar14 & 7;
              uVar21 = ms->hashCache[uVar34];
              ms->hashCache[uVar34] =
                   (uint)(*(int *)(pBVar17 + uVar14 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
              uVar35 = (ulong)(uVar21 >> 4 & 0xfffffff0);
              uVar34 = (byte)((char)pUVar6[uVar35] - 1) & 0xf;
              *(char *)(pUVar6 + uVar35) = (char)uVar34;
              *(char *)((long)pUVar6 + (ulong)uVar34 + 1 + uVar35 * 2) = (char)uVar21;
              pUVar5[uVar35 + uVar34] = (uint)uVar14;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (uint)(*(int *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar20 & 0x1f);
            uVar12 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar6[uVar12];
            pcVar1 = (char *)((long)pUVar6 + uVar12 * 2 + 1);
            uVar80 = (undefined1)(uVar21 >> 0x18);
            uVar78 = (undefined1)(uVar21 >> 0x10);
            uVar76 = (undefined1)(uVar21 >> 8);
            auVar74._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar21)) >>
                      0x20);
            auVar74[3] = uVar76;
            auVar74[2] = uVar76;
            auVar74[0] = (undefined1)uVar21;
            auVar74[1] = auVar74[0];
            auVar74._8_8_ = 0;
            auVar83 = pshuflw(auVar74,auVar74,0);
            cVar49 = auVar83[0];
            auVar75[0] = -(cVar49 == *pcVar1);
            cVar77 = auVar83[1];
            auVar75[1] = -(cVar77 == pcVar1[1]);
            cVar79 = auVar83[2];
            auVar75[2] = -(cVar79 == pcVar1[2]);
            cVar81 = auVar83[3];
            auVar75[3] = -(cVar81 == pcVar1[3]);
            auVar75[4] = -(cVar49 == pcVar1[4]);
            auVar75[5] = -(cVar77 == pcVar1[5]);
            auVar75[6] = -(cVar79 == pcVar1[6]);
            auVar75[7] = -(cVar81 == pcVar1[7]);
            auVar75[8] = -(cVar49 == pcVar1[8]);
            auVar75[9] = -(cVar77 == pcVar1[9]);
            auVar75[10] = -(cVar79 == pcVar1[10]);
            auVar75[0xb] = -(cVar81 == pcVar1[0xb]);
            auVar75[0xc] = -(cVar49 == pcVar1[0xc]);
            auVar75[0xd] = -(cVar77 == pcVar1[0xd]);
            auVar75[0xe] = -(cVar79 == pcVar1[0xe]);
            auVar75[0xf] = -(cVar81 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar75 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar75[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar38 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar38));
                lVar38 = lVar38 + 1) {
              iVar32 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
                }
              }
              if (pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar6 + uVar12) = (char)uVar21;
            *(undefined1 *)((long)(pUVar6 + uVar12) + (ulong)uVar21 + 1) = auVar74[0];
            UVar29 = ms->nextToUpdate;
            ms->nextToUpdate = UVar29 + 1;
            pUVar5[uVar12 + uVar21] = UVar29;
            uVar35 = 999999999;
            uVar15 = 3;
            for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
              uVar21 = auStack_c8[lVar28];
              if (uVar21 < uVar33) {
                if (*(int *)(pBVar25 + uVar21) == *pIn) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar21 + 4,iEnd,
                                      pBVar25 + uVar33,pBVar17 + uVar33);
                  sVar13 = sVar13 + 4;
LAB_001e0064:
                  if ((uVar15 < sVar13) &&
                     (uVar35 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)pIn + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
                goto LAB_001e0064;
              }
            }
          }
        }
        else if (uVar23 - 6 < 2) {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432340650000) >>
                      (bVar19 & 0x3f));
            uVar35 = (ulong)(uVar34 >> 3 & 0xffffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar19 & 0x3f));
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar89._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar89[3] = uVar76;
          auVar89[2] = uVar76;
          auVar89[0] = (byte)uVar30;
          auVar89[1] = auVar89[0];
          auVar89._8_8_ = 0;
          auVar83 = pshuflw(auVar89,auVar89,0);
          bVar20 = auVar83[0];
          auVar46[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar46[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar46[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar46[3] = -((byte)pUVar6[2] == bVar94);
          auVar46[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar46[5] = -((byte)pUVar6[3] == bVar92);
          auVar46[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar46[7] = -((byte)pUVar6[4] == bVar94);
          auVar46[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar46[9] = -((byte)pUVar6[5] == bVar92);
          auVar46[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar46[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar46[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar46[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar46[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar46[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar67[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar67[1] = -((byte)pUVar6[9] == bVar92);
          auVar67[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar67[3] = -((byte)pUVar6[10] == bVar94);
          auVar67[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar67[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar67[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar67[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar67[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar67[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar67[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar67[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar67[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar67[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar67[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar67[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar67[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar46 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar46[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar32 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar89[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001df657:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001df657;
            }
          }
        }
        else if (uVar23 == 5) {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar14 + 8) * -0x30e4432345000000) >>
                      (bVar19 & 0x3f));
            uVar35 = (ulong)(uVar34 >> 3 & 0x1fffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar19 & 0x3f));
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar90._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar90[3] = uVar76;
          auVar90[2] = uVar76;
          auVar90[0] = (byte)uVar30;
          auVar90[1] = auVar90[0];
          auVar90._8_8_ = 0;
          auVar83 = pshuflw(auVar90,auVar90,0);
          bVar20 = auVar83[0];
          auVar47[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar47[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar47[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar47[3] = -((byte)pUVar6[2] == bVar94);
          auVar47[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar47[5] = -((byte)pUVar6[3] == bVar92);
          auVar47[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar47[7] = -((byte)pUVar6[4] == bVar94);
          auVar47[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar47[9] = -((byte)pUVar6[5] == bVar92);
          auVar47[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar47[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar47[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar47[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar47[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar47[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar70[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar70[1] = -((byte)pUVar6[9] == bVar92);
          auVar70[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar70[3] = -((byte)pUVar6[10] == bVar94);
          auVar70[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar70[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar70[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar70[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar70[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar70[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar70[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar70[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar70[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar70[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar70[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar70[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar70[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar47[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar32 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar90[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dfce3:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001dfce3;
            }
          }
        }
        else {
          pUVar5 = ms->hashTable;
          pUVar6 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar25 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar12 = (long)pIn - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar33 = (uint)uVar12;
          UVar29 = ms->loadedDictEnd;
          bVar19 = 0x18 - (char)ms->rowHashLog;
          for (uVar14 = (ulong)ms->nextToUpdate; uVar14 < (uVar12 & 0xffffffff); uVar14 = uVar14 + 1
              ) {
            uVar37 = (uint)uVar14 & 7;
            uVar34 = ms->hashCache[uVar37];
            ms->hashCache[uVar37] =
                 (uint)(*(int *)(pBVar17 + uVar14 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
            uVar35 = (ulong)(uVar34 >> 3 & 0xffffffe0);
            uVar37 = (byte)((char)pUVar6[uVar35] - 1) & 0x1f;
            *(char *)(pUVar6 + uVar35) = (char)uVar37;
            *(char *)((long)pUVar6 + (ulong)uVar37 + 1 + uVar35 * 2) = (char)uVar34;
            pUVar5[uVar35 + uVar37] = (uint)uVar14;
          }
          if (UVar29 == 0 && uVar30 < uVar33 - uVar23) {
            uVar23 = uVar33 - uVar30;
          }
          ms->nextToUpdate = uVar33;
          uVar30 = ms->hashCache[uVar33 & 7];
          ms->hashCache[uVar33 & 7] =
               (uint)(*(int *)(pBVar17 + (uVar12 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar19 & 0x1f);
          uVar12 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar6 = pUVar6 + uVar12;
          bVar19 = (byte)*pUVar6;
          uVar80 = (undefined1)(uVar30 >> 0x18);
          uVar78 = (undefined1)(uVar30 >> 0x10);
          uVar76 = (undefined1)(uVar30 >> 8);
          auVar91._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar78),CONCAT14(uVar78,uVar30)) >>
                    0x20);
          auVar91[3] = uVar76;
          auVar91[2] = uVar76;
          auVar91[0] = (byte)uVar30;
          auVar91[1] = auVar91[0];
          auVar91._8_8_ = 0;
          auVar83 = pshuflw(auVar91,auVar91,0);
          bVar20 = auVar83[0];
          auVar48[0] = -(*(byte *)((long)pUVar6 + 1) == bVar20);
          bVar92 = auVar83[1];
          auVar48[1] = -((byte)pUVar6[1] == bVar92);
          bVar93 = auVar83[2];
          auVar48[2] = -(*(byte *)((long)pUVar6 + 3) == bVar93);
          bVar94 = auVar83[3];
          auVar48[3] = -((byte)pUVar6[2] == bVar94);
          auVar48[4] = -(*(byte *)((long)pUVar6 + 5) == bVar20);
          auVar48[5] = -((byte)pUVar6[3] == bVar92);
          auVar48[6] = -(*(byte *)((long)pUVar6 + 7) == bVar93);
          auVar48[7] = -((byte)pUVar6[4] == bVar94);
          auVar48[8] = -(*(byte *)((long)pUVar6 + 9) == bVar20);
          auVar48[9] = -((byte)pUVar6[5] == bVar92);
          auVar48[10] = -(*(byte *)((long)pUVar6 + 0xb) == bVar93);
          auVar48[0xb] = -((byte)pUVar6[6] == bVar94);
          auVar48[0xc] = -(*(byte *)((long)pUVar6 + 0xd) == bVar20);
          auVar48[0xd] = -((byte)pUVar6[7] == bVar92);
          auVar48[0xe] = -(*(byte *)((long)pUVar6 + 0xf) == bVar93);
          auVar48[0xf] = -((byte)pUVar6[8] == bVar94);
          auVar73[0] = -(*(byte *)((long)pUVar6 + 0x11) == bVar20);
          auVar73[1] = -((byte)pUVar6[9] == bVar92);
          auVar73[2] = -(*(byte *)((long)pUVar6 + 0x13) == bVar93);
          auVar73[3] = -((byte)pUVar6[10] == bVar94);
          auVar73[4] = -(*(byte *)((long)pUVar6 + 0x15) == bVar20);
          auVar73[5] = -((byte)pUVar6[0xb] == bVar92);
          auVar73[6] = -(*(byte *)((long)pUVar6 + 0x17) == bVar93);
          auVar73[7] = -((byte)pUVar6[0xc] == bVar94);
          auVar73[8] = -(*(byte *)((long)pUVar6 + 0x19) == bVar20);
          auVar73[9] = -((byte)pUVar6[0xd] == bVar92);
          auVar73[10] = -(*(byte *)((long)pUVar6 + 0x1b) == bVar93);
          auVar73[0xb] = -((byte)pUVar6[0xe] == bVar94);
          auVar73[0xc] = -(*(byte *)((long)pUVar6 + 0x1d) == bVar20);
          auVar73[0xd] = -((byte)pUVar6[0xf] == bVar92);
          auVar73[0xe] = -(*(byte *)((long)pUVar6 + 0x1f) == bVar93);
          auVar73[0xf] = -((byte)pUVar6[0x10] == bVar94);
          uVar34 = CONCAT22((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar73[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar48 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar48[0xf] >> 7) << 0xf);
          uVar30 = uVar34 >> (bVar19 & 0x1f) | uVar34 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar34;
          }
          for (lVar38 = 0; (uVar30 != 0 && ((int)lVar38 != 0x20)); lVar38 = lVar38 + 1) {
            iVar32 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
              }
            }
            if (pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_c8[lVar38] = pUVar5[uVar12 + (iVar32 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar6 = (byte)uVar23;
          *(byte *)((long)pUVar6 + (ulong)uVar23 + 1) = auVar91[0];
          UVar29 = ms->nextToUpdate;
          ms->nextToUpdate = UVar29 + 1;
          pUVar5[uVar12 + uVar23] = UVar29;
          uVar35 = 999999999;
          uVar15 = 3;
          for (lVar28 = 0; lVar38 != lVar28; lVar28 = lVar28 + 1) {
            uVar23 = auStack_c8[lVar28];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar25 + uVar23) == *pIn) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar31 + 6),pBVar25 + (ulong)uVar23 + 4,iEnd,
                                    pBVar25 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dff8d:
                if ((uVar15 < sVar13) &&
                   (uVar35 = (ulong)((uVar33 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)pIn + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)pIn + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar23,iEnd);
              goto LAB_001dff8d;
            }
          }
        }
        if (uVar15 < 4) break;
        uVar23 = (int)local_178 + 1;
        uVar21 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar23 = (int)uVar35 + 1;
        iVar32 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> iVar32 == 0; iVar32 = iVar32 + -1) {
          }
        }
        local_188 = pIn;
      } while ((int)((uVar21 ^ 0x1f) + (int)local_150 * 4 + -0x18) < (int)uVar15 * 4 - iVar32);
      if (local_178 == 0) {
        UVar29 = 1;
      }
      else {
        pBVar24 = (BYTE *)((long)local_128 + (-(long)base - local_178) + 2);
        pBVar25 = iStart;
        pBVar17 = base;
        if ((uint)pBVar24 < uVar3) {
          pBVar25 = local_40;
          pBVar17 = pBVar4;
        }
        pBVar17 = pBVar17 + ((ulong)pBVar24 & 0xffffffff);
        for (; ((src < local_128 && (pBVar25 < pBVar17)) &&
               (*(BYTE *)((long)local_128 + -1) == pBVar17[-1]));
            local_128 = (int *)((long)local_128 + -1)) {
          pBVar17 = pBVar17 + -1;
          local_150 = local_150 + 1;
        }
        UVar29 = (int)local_178 + 1;
        UVar27 = local_13c;
        local_13c = (int)local_178 - 2;
      }
      uVar12 = (long)local_128 - (long)src;
      pBVar17 = seqStore->lit;
      if (ilimit_w < local_128) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)local_128,(BYTE *)ilimit_w);
LAB_001e01f4:
        seqStore->lit = seqStore->lit + uVar12;
        psVar18 = seqStore->sequences;
        if (0xffff < uVar12) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar17 = *src;
        *(undefined8 *)(pBVar17 + 8) = uVar9;
        pBVar17 = seqStore->lit;
        if (0x10 < uVar12) {
          uVar9 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar17 + 0x18) = uVar9;
          if (0x20 < (long)uVar12) {
            lVar38 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar38 + 0x20);
              uVar9 = puVar2[1];
              pBVar25 = pBVar17 + lVar38 + 0x20;
              *(undefined8 *)pBVar25 = *puVar2;
              *(undefined8 *)(pBVar25 + 8) = uVar9;
              puVar2 = (undefined8 *)((long)src + lVar38 + 0x30);
              uVar9 = puVar2[1];
              *(undefined8 *)(pBVar25 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar25 + 0x18) = uVar9;
              lVar38 = lVar38 + 0x20;
            } while (pBVar25 + 0x20 < pBVar17 + uVar12);
          }
          goto LAB_001e01f4;
        }
        seqStore->lit = pBVar17 + uVar12;
        psVar18 = seqStore->sequences;
      }
      psVar18->litLength = (U16)uVar12;
      psVar18->offset = UVar29;
      if (0xffff < local_150 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->matchLength = (U16)(local_150 - 3);
      seqStore->sequences = psVar18 + 1;
      UVar29 = UVar27;
      for (local_188 = (int *)((long)local_128 + local_150); UVar27 = UVar29, src = local_188,
          local_188 <= iLimit; local_188 = (int *)((long)local_188 + sVar13 + 4)) {
        iVar36 = (int)local_188 - (int)base;
        UVar29 = (ms->window).lowLimit;
        UVar22 = iVar36 - uVar10;
        if (iVar36 - UVar29 <= uVar10) {
          UVar22 = UVar29;
        }
        if (ms->loadedDictEnd != 0) {
          UVar22 = UVar29;
        }
        uVar21 = iVar36 - UVar27;
        pBVar17 = base;
        if (uVar21 < uVar3) {
          pBVar17 = pBVar4;
        }
        if (((iVar11 - uVar21 < 3) || (iVar36 - UVar22 <= UVar27)) ||
           (*local_188 != *(int *)(pBVar17 + uVar21))) break;
        pBVar25 = iEnd;
        if (uVar21 < uVar3) {
          pBVar25 = pBVar26;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)(local_188 + 1),(BYTE *)((long)(pBVar17 + uVar21) + 4),iEnd,
                            pBVar25,iStart);
        pBVar17 = seqStore->lit;
        if (ilimit_w < local_188) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_188,(BYTE *)local_188,(BYTE *)ilimit_w);
        }
        else {
          uVar9 = *(undefined8 *)(local_188 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_188;
          *(undefined8 *)(pBVar17 + 8) = uVar9;
        }
        psVar18 = seqStore->sequences;
        psVar18->litLength = 0;
        psVar18->offset = 1;
        if (0xffff < sVar13 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(sVar13 + 1);
        seqStore->sequences = psVar18 + 1;
        UVar29 = local_13c;
        local_13c = UVar27;
      }
      goto LAB_001dc9fc;
    }
    local_188 = (int *)((long)local_188 + ((long)local_188 - (long)src >> 8) + 1);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}